

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O2

unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> wabt::MakeUnique<wabt::Script>(void)

{
  undefined8 *puVar1;
  __uniq_ptr_data<wabt::Script,_std::default_delete<wabt::Script>,_true,_true> in_RDI;
  
  puVar1 = (undefined8 *)operator_new(0x50);
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  puVar1[5] = 0;
  puVar1[6] = 0;
  puVar1[7] = 0;
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[3] = puVar1 + 9;
  puVar1[4] = 1;
  puVar1[5] = 0;
  puVar1[6] = 0;
  *(undefined4 *)(puVar1 + 7) = 0x3f800000;
  puVar1[8] = 0;
  puVar1[9] = 0;
  *(undefined8 **)
   in_RDI.super___uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_>._M_t.
   super__Tuple_impl<0UL,_wabt::Script_*,_std::default_delete<wabt::Script>_>.
   super__Head_base<0UL,_wabt::Script_*,_false>._M_head_impl = puVar1;
  return (__uniq_ptr_data<wabt::Script,_std::default_delete<wabt::Script>,_true,_true>)
         (tuple<wabt::Script_*,_std::default_delete<wabt::Script>_>)
         in_RDI.super___uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_>._M_t.
         super__Tuple_impl<0UL,_wabt::Script_*,_std::default_delete<wabt::Script>_>.
         super__Head_base<0UL,_wabt::Script_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}